

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

int hasB64Wrapper(string_view str)

{
  int iVar1;
  const_reference pvVar2;
  size_type sVar3;
  size_type in_stack_00000010;
  size_type in_stack_00000018;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_00000020;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::front(&local_18);
  if (*pvVar2 == '\"') {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
    if (sVar3 < 8) {
      return 0;
    }
    iVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (in_stack_00000020,in_stack_00000018,in_stack_00000010,str._M_str);
    if (iVar1 == 0) {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&local_18,sVar3 - 2);
      if (*pvVar2 == ']') {
        return 5;
      }
    }
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
    if (sVar3 < 0xb) {
      return 0;
    }
    iVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (in_stack_00000020,in_stack_00000018,in_stack_00000010,str._M_str);
    if (iVar1 == 0) {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
      pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::operator[]
                         (&local_18,sVar3 - 2);
      if (*pvVar2 == ']') {
        return 8;
      }
    }
  }
  else {
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
    if (sVar3 < 6) {
      return 0;
    }
    iVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (in_stack_00000020,in_stack_00000018,in_stack_00000010,str._M_str);
    if ((iVar1 == 0) &&
       (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::back(&local_18),
       *pvVar2 == ']')) {
      return 4;
    }
    sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_18);
    if (sVar3 < 9) {
      return 0;
    }
    iVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (in_stack_00000020,in_stack_00000018,in_stack_00000010,str._M_str);
    if ((iVar1 == 0) &&
       (pvVar2 = std::basic_string_view<char,_std::char_traits<char>_>::back(&local_18),
       *pvVar2 == ']')) {
      return 7;
    }
  }
  return 0;
}

Assistant:

static int hasB64Wrapper(std::string_view str)
{
    if (str.front() == '\"') {
        if (str.size() < 8) {
            return 0;
        }
        if ((str.compare(2, 3, "64[") == 0) && (str[str.size() - 2] == ']')) {
            return 5;
        }
        if (str.size() < 11) {
            return 0;
        }
        if ((str.compare(5, 3, "64[") == 0) && (str[str.size() - 2] == ']')) {
            return 8;
        }
    } else {
        if (str.size() < 6) {
            return 0;
        }
        if ((str.compare(1, 3, "64[") == 0) && (str.back() == ']')) {
            return 4;
        }
        if (str.size() < 9) {
            return 0;
        }
        if ((str.compare(4, 3, "64[") == 0) && (str.back() == ']')) {
            return 7;
        }
    }

    return 0;
}